

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix4 * matrix4_invert(matrix4 *self)

{
  matrix4 *pmVar1;
  long lVar2;
  matrix4 *pmVar3;
  byte bVar4;
  matrix4 inverse;
  matrix4 mStack_88;
  
  bVar4 = 0;
  pmVar1 = matrix4_inverse(self,&mStack_88);
  if (pmVar1 != (matrix4 *)0x0) {
    pmVar1 = &mStack_88;
    pmVar3 = self;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      (pmVar3->field_0).m[0] = *(double *)pmVar1;
      pmVar1 = (matrix4 *)((long)pmVar1 + ((ulong)bVar4 * -2 + 1) * 8);
      pmVar3 = (matrix4 *)((long)pmVar3 + (ulong)bVar4 * -0x10 + 8);
    }
  }
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_invert(struct matrix4 *self)
{
	struct matrix4 inverse;
	uint8_t i;

	if (matrix4_inverse(self, &inverse)) {
		for (i = 0; i < 16; i++) {
			self->m[i] = inverse.m[i];
		}
	}

	return self;
}